

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O1

TonkConnectionConfig * tonk::SDKSocket::MakeConnectionConfig(SDKConnection *sdkConnection)

{
  TonkConnectionConfig *in_RDI;
  
  in_RDI->AppContextPtr = (TonkAppContextPtr)0x0;
  in_RDI->OnConnect = (_func_void_TonkAppContextPtr_TonkConnection *)0x0;
  in_RDI->OnData = (_func_void_TonkAppContextPtr_TonkConnection_uint32_t_uint8_t_ptr_uint32_t *)0x0;
  in_RDI->OnTick = (_func_void_TonkAppContextPtr_TonkConnection_uint64_t *)0x0;
  in_RDI->AppContextPtr = sdkConnection;
  in_RDI->OnConnect = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  in_RDI->OnTick = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  in_RDI->OnData = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  in_RDI->OnClose = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  return in_RDI;
}

Assistant:

TonkConnectionConfig SDKSocket::MakeConnectionConfig(SDKConnection* sdkConnection)
{
    TonkConnectionConfig config;
    config.AppContextPtr = reinterpret_cast<TonkAppContextPtr>(sdkConnection);

    config.OnConnect = [](
        TonkAppContextPtr context,
        TonkConnection /*connection*/)
    {
        SDKConnection* conn = (SDKConnection*)context;
        conn->OnConnect();
    };
    config.OnTick = [](
        TonkAppContextPtr context,
        TonkConnection /*connection*/,
        uint64_t nowUsec)
    {
        SDKConnection* conn = (SDKConnection*)context;
        conn->OnTick(nowUsec);
    };
    config.OnData = [](
        TonkAppContextPtr context,
        TonkConnection /*connection*/,
        uint32_t channel,
        const uint8_t* data,
        uint32_t bytes)
    {
        SDKConnection* conn = (SDKConnection*)context;
        conn->OnData(channel, data, bytes);
    };
    config.OnClose = [](
        TonkAppContextPtr context,
        TonkConnection /*connection*/,
        TonkResult reason,
        const char* reasonJson)
    {
        SDKConnection* conn = (SDKConnection*)context;
        SDKJsonResult result;
        result.ErrorJson = reasonJson;
        result.Result = reason;
        conn->OnClose(result);

        // Release self-reference here, allowing object to go out of scope.
        conn->SelfReference.reset();
    };

    return config;
}